

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

int aec_decode_init(aec_stream_conflict *strm)

{
  int iVar1;
  undefined8 *__s;
  void *pvVar2;
  long in_RDI;
  int i;
  int modi;
  internal_state_conflict *state;
  int local_20;
  int local_4;
  
  if ((*(uint *)(in_RDI + 0x30) < 0x21) && (*(int *)(in_RDI + 0x30) != 0)) {
    __s = (undefined8 *)malloc(0x350);
    if (__s == (undefined8 *)0x0) {
      local_4 = -4;
    }
    else {
      memset(__s,0,0x350);
      create_se_table((int *)(__s + 0xf));
      *(undefined8 **)(in_RDI + 0x40) = __s;
      if (*(uint *)(in_RDI + 0x30) < 0x11) {
        if (*(uint *)(in_RDI + 0x30) < 9) {
          if ((*(uint *)(in_RDI + 0x3c) & 0x10) == 0) {
            *(undefined4 *)((long)__s + 0xc) = 3;
          }
          else {
            if (4 < *(uint *)(in_RDI + 0x30)) {
              return -1;
            }
            if (*(uint *)(in_RDI + 0x30) < 3) {
              *(undefined4 *)((long)__s + 0xc) = 1;
            }
            else {
              *(undefined4 *)((long)__s + 0xc) = 2;
            }
          }
          *(undefined4 *)((long)__s + 0x54) = 1;
          *(undefined4 *)(__s + 6) = *(undefined4 *)(in_RDI + 0x34);
          __s[3] = flush_8;
        }
        else {
          *(undefined4 *)((long)__s + 0x54) = 2;
          *(undefined4 *)((long)__s + 0xc) = 4;
          *(int *)(__s + 6) = *(int *)(in_RDI + 0x34) << 1;
          if ((*(uint *)(in_RDI + 0x3c) & 4) == 0) {
            __s[3] = flush_lsb_16;
          }
          else {
            __s[3] = flush_msb_16;
          }
        }
      }
      else {
        *(undefined4 *)((long)__s + 0xc) = 5;
        if ((*(uint *)(in_RDI + 0x30) < 0x19) && ((*(uint *)(in_RDI + 0x3c) & 2) != 0)) {
          *(undefined4 *)((long)__s + 0x54) = 3;
          if ((*(uint *)(in_RDI + 0x3c) & 4) == 0) {
            __s[3] = flush_lsb_24;
          }
          else {
            __s[3] = flush_msb_24;
          }
        }
        else {
          *(undefined4 *)((long)__s + 0x54) = 4;
          if ((*(uint *)(in_RDI + 0x3c) & 4) == 0) {
            __s[3] = flush_lsb_32;
          }
          else {
            __s[3] = flush_msb_32;
          }
        }
        *(int *)(__s + 6) = *(int *)(in_RDI + 0x34) * *(int *)((long)__s + 0x54);
      }
      if ((*(uint *)(in_RDI + 0x3c) & 1) == 0) {
        *(undefined4 *)((long)__s + 0x24) = 0;
        *(uint *)(__s + 5) = 0xffffffff >> (0x20U - (char)*(undefined4 *)(in_RDI + 0x30) & 0x1f);
      }
      else {
        *(uint *)(__s + 5) = 0xffffffff >> (0x21U - (char)*(undefined4 *)(in_RDI + 0x30) & 0x1f);
        *(uint *)((long)__s + 0x24) = *(uint *)(__s + 5) ^ 0xffffffff;
      }
      *(uint *)((long)__s + 0x2c) =
           ((uint)(*(int *)(in_RDI + 0x34) * *(int *)(in_RDI + 0x30) + *(int *)((long)__s + 0xc)) >>
           3) + 0x10;
      iVar1 = (int)(1L << ((byte)*(undefined4 *)((long)__s + 0xc) & 0x3f));
      pvVar2 = malloc((long)iVar1 << 3);
      __s[2] = pvVar2;
      if (__s[2] == 0) {
        local_4 = -4;
      }
      else {
        *(code **)__s[2] = m_low_entropy;
        for (local_20 = 1; local_20 < iVar1 + -1; local_20 = local_20 + 1) {
          *(code **)(__s[2] + (long)local_20 * 8) = m_split;
        }
        *(code **)(__s[2] + (long)(iVar1 + -1) * 8) = m_uncomp;
        __s[0xd] = (ulong)(uint)(*(int *)(in_RDI + 0x38) * *(int *)(in_RDI + 0x34));
        pvVar2 = malloc(__s[0xd] << 2);
        __s[0xb] = pvVar2;
        if (__s[0xb] == 0) {
          local_4 = -4;
        }
        else {
          *(uint *)(__s + 10) = *(uint *)(in_RDI + 0x3c) & 8;
          if (*(int *)(__s + 10) == 0) {
            *(undefined4 *)(__s + 9) = 0;
            *(undefined4 *)((long)__s + 0x4c) = *(undefined4 *)(in_RDI + 0x34);
          }
          else {
            *(undefined4 *)(__s + 9) = 1;
            *(int *)((long)__s + 0x4c) = *(int *)(in_RDI + 0x34) + -1;
          }
          *(undefined8 *)(in_RDI + 0x10) = 0;
          *(undefined8 *)(in_RDI + 0x28) = 0;
          __s[0xc] = __s[0xb];
          __s[0xe] = __s[0xb];
          *(undefined4 *)(__s + 8) = 0;
          *(undefined4 *)((long)__s + 0x44) = 0;
          *__s = m_id;
          local_4 = 0;
        }
      }
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int aec_decode_init(struct aec_stream *strm)
{
    struct internal_state *state;

    if (strm->bits_per_sample > 32 || strm->bits_per_sample == 0)
        return AEC_CONF_ERROR;

    state = malloc(sizeof(struct internal_state));
    if (state == NULL)
        return AEC_MEM_ERROR;
    memset(state, 0, sizeof(struct internal_state));

    create_se_table(state->se_table);

    strm->state = state;

    if (strm->bits_per_sample > 16) {
        state->id_len = 5;

        if (strm->bits_per_sample <= 24 && strm->flags & AEC_DATA_3BYTE) {
            state->bytes_per_sample = 3;
            if (strm->flags & AEC_DATA_MSB)
                state->flush_output = flush_msb_24;
            else
                state->flush_output = flush_lsb_24;
        } else {
            state->bytes_per_sample = 4;
            if (strm->flags & AEC_DATA_MSB)
                state->flush_output = flush_msb_32;
            else
                state->flush_output = flush_lsb_32;
        }
        state->out_blklen = strm->block_size * state->bytes_per_sample;
    }
    else if (strm->bits_per_sample > 8) {
        state->bytes_per_sample = 2;
        state->id_len = 4;
        state->out_blklen = strm->block_size * 2;
        if (strm->flags & AEC_DATA_MSB)
            state->flush_output = flush_msb_16;
        else
            state->flush_output = flush_lsb_16;
    } else {
        if (strm->flags & AEC_RESTRICTED) {
            if (strm->bits_per_sample <= 4) {
                if (strm->bits_per_sample <= 2)
                    state->id_len = 1;
                else
                    state->id_len = 2;
            } else {
                return AEC_CONF_ERROR;
            }
        } else {
            state->id_len = 3;
        }

        state->bytes_per_sample = 1;
        state->out_blklen = strm->block_size;
        state->flush_output = flush_8;
    }

    if (strm->flags & AEC_DATA_SIGNED) {
        state->xmax = UINT32_MAX >> (32 - strm->bits_per_sample + 1);
        state->xmin = ~state->xmax;
    } else {
        state->xmin = 0;
        state->xmax = UINT32_MAX >> (32 - strm->bits_per_sample);
    }

    state->in_blklen = (strm->block_size * strm->bits_per_sample
                        + state->id_len) / 8 + 16;

    int modi = 1UL << state->id_len;
    state->id_table = malloc(modi * sizeof(int (*)(struct aec_stream *)));
    if (state->id_table == NULL)
        return AEC_MEM_ERROR;

    state->id_table[0] = m_low_entropy;
    for (int i = 1; i < modi - 1; i++) {
        state->id_table[i] = m_split;
    }
    state->id_table[modi - 1] = m_uncomp;

    state->rsi_size = strm->rsi * strm->block_size;
    state->rsi_buffer = malloc(state->rsi_size * sizeof(uint32_t));
    if (state->rsi_buffer == NULL)
        return AEC_MEM_ERROR;

    state->pp = strm->flags & AEC_DATA_PREPROCESS;
    if (state->pp) {
        state->ref = 1;
        state->encoded_block_size = strm->block_size - 1;
    } else {
        state->ref = 0;
        state->encoded_block_size = strm->block_size;
    }
    strm->total_in = 0;
    strm->total_out = 0;

    state->rsip = state->rsi_buffer;
    state->flush_start = state->rsi_buffer;
    state->bitp = 0;
    state->fs = 0;
    state->mode = m_id;
    return AEC_OK;
}